

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::SerialArena::AllocateNewBlock
          (SerialArena *this,size_t n,AllocationPolicy *policy)

{
  char *pcVar1;
  Block *pBVar2;
  char *pcVar3;
  Memory MVar4;
  
  pBVar2 = this->head_;
  pBVar2->start = (CleanupNode *)this->limit_;
  pcVar3 = this->ptr_;
  pcVar1 = Block::Pointer(pBVar2,0x18);
  this->space_used_ = (size_t)(pcVar3 + (this->space_used_ - (long)pcVar1));
  MVar4 = AllocateMemory(policy,this->head_->size,n);
  pBVar2 = (Block *)MVar4.ptr;
  (this->space_allocated_).super___atomic_base<unsigned_long>._M_i =
       (this->space_allocated_).super___atomic_base<unsigned_long>._M_i + MVar4.size;
  pBVar2->next = this->head_;
  pBVar2->size = MVar4.size;
  pBVar2->start = (CleanupNode *)0x0;
  this->head_ = pBVar2;
  pcVar3 = Block::Pointer(pBVar2,0x18);
  this->ptr_ = pcVar3;
  pcVar3 = Block::Pointer(this->head_,this->head_->size);
  this->limit_ = pcVar3;
  return;
}

Assistant:

void SerialArena::AllocateNewBlock(size_t n, const AllocationPolicy* policy) {
  // Sync limit to block
  head_->start = reinterpret_cast<CleanupNode*>(limit_);

  // Record how much used in this block.
  space_used_ += ptr_ - head_->Pointer(kBlockHeaderSize);

  auto mem = AllocateMemory(policy, head_->size, n);
  // We don't want to emit an expensive RMW instruction that requires
  // exclusive access to a cacheline. Hence we write it in terms of a
  // regular add.
  auto relaxed = std::memory_order_relaxed;
  space_allocated_.store(space_allocated_.load(relaxed) + mem.size, relaxed);
  head_ = new (mem.ptr) Block{head_, mem.size};
  ptr_ = head_->Pointer(kBlockHeaderSize);
  limit_ = head_->Pointer(head_->size);

#ifdef ADDRESS_SANITIZER
  ASAN_POISON_MEMORY_REGION(ptr_, limit_ - ptr_);
#endif  // ADDRESS_SANITIZER
}